

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

void __thiscall
QVarLengthArray<unsigned_char,_256LL>::QVarLengthArray
          (QVarLengthArray<unsigned_char,_256LL> *this,qsizetype asize)

{
  void *pvVar1;
  size_t in_RSI;
  QVarLengthArray<unsigned_char,_256LL> *in_RDI;
  size_t unaff_retaddr;
  size_t in_stack_ffffffffffffffe8;
  QVarLengthArray<unsigned_char,_256LL> *capacity;
  
  capacity = in_RDI;
  QVarLengthArray(in_RDI);
  if (0x100 < (long)in_RSI) {
    (in_RDI->super_QVLABase<unsigned_char>).super_QVLABaseBase.a = in_RSI;
    pvVar1 = QtPrivate::fittedMalloc
                       (unaff_retaddr,(qsizetype *)capacity,in_RSI,in_stack_ffffffffffffffe8);
    (in_RDI->super_QVLABase<unsigned_char>).super_QVLABaseBase.ptr = pvVar1;
    if ((in_RDI->super_QVLABase<unsigned_char>).super_QVLABaseBase.ptr == (void *)0x0) {
      qBadAlloc();
    }
  }
  (in_RDI->super_QVLABase<unsigned_char>).super_QVLABaseBase.s = in_RSI;
  return;
}

Assistant:

Q_INLINE_TEMPLATE QVarLengthArray<T, Prealloc>::QVarLengthArray(qsizetype asize)
    : QVarLengthArray()
{
    Q_ASSERT_X(asize >= 0, "QVarLengthArray::QVarLengthArray(qsizetype)",
               "Size must be greater than or equal to 0.");

    // historically, this ctor worked for non-copyable/non-movable T, so keep it working, why not?
    // resize(asize) // this requires a movable or copyable T, can't use, need to do it by hand

    if (asize > Prealloc) {
        this->a = asize;
        this->ptr = QtPrivate::fittedMalloc(0, &this->a, sizeof(T));
        Q_CHECK_PTR(this->ptr);
    }
    if constexpr (QTypeInfo<T>::isComplex)
        std::uninitialized_default_construct_n(data(), asize);
    this->s = asize;
}